

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_remove_operations(adios2_variable *variable)

{
  allocator local_48 [32];
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"for adios2_variable, in call to adios2_remove_operations",local_48
            );
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  adios2::core::VariableBase::RemoveOperations();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_remove_operations(adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_remove_operations");
        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->RemoveOperations();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_remove_operations"));
    }
}